

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_setpoint.cpp
# Opt level: O2

void __thiscall
chrono::ChFunctionRotation_setpoint::ArchiveIN
          (ChFunctionRotation_setpoint *this,ChArchiveIn *marchive)

{
  eChSetpointMode_mapper mmapper;
  ChEnumMapper<chrono::ChFunctionRotation_setpoint::eChSetpointMode> local_c0;
  ChEnumMapper<chrono::ChFunctionRotation_setpoint::eChSetpointMode> local_a0;
  ChNameValue<chrono::ChVector<double>_> local_80;
  ChNameValue<chrono::ChVector<double>_> local_68;
  ChNameValue<chrono::ChQuaternion<double>_> local_50;
  ChNameValue<chrono::ChEnumMapper<chrono::ChFunctionRotation_setpoint::eChSetpointMode>_> local_38;
  
  ChArchiveIn::VersionRead<chrono::ChFunctionRotation_setpoint>(marchive);
  ChFunctionRotation::ArchiveIN(&this->super_ChFunctionRotation,marchive);
  eChSetpointMode_mapper::eChSetpointMode_mapper((eChSetpointMode_mapper *)&local_a0);
  eChSetpointMode_mapper::operator()(&local_c0,(eChSetpointMode_mapper *)&local_a0,&this->mode);
  local_38._name = "mode";
  local_38._flags = '\0';
  local_38._value = &local_c0;
  ChArchiveIn::operator>>(marchive,&local_38);
  ChEnumMapper<chrono::ChFunctionRotation_setpoint::eChSetpointMode>::~ChEnumMapper(&local_c0);
  local_50._value = &this->Q;
  local_50._name = "Q";
  local_50._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_50);
  local_68._value = &this->W;
  local_68._name = "W";
  local_68._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_68);
  local_80._value = &this->A;
  local_80._name = "A";
  local_80._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_80);
  ChEnumMapper<chrono::ChFunctionRotation_setpoint::eChSetpointMode>::~ChEnumMapper(&local_a0);
  return;
}

Assistant:

void ChFunctionRotation_setpoint::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunctionRotation_setpoint>();
    // deserialize parent class
    ChFunctionRotation::ArchiveIN(marchive);
    // deserialize all member data:
    eChSetpointMode_mapper mmapper;
    marchive >> CHNVP(mmapper(mode), "mode");
    marchive >> CHNVP(Q);
    marchive >> CHNVP(W);
    marchive >> CHNVP(A);
}